

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

HelicsEndpoint helicsFederateGetEndpoint(HelicsFederate fed,char *name,HelicsError *err)

{
  size_t sVar1;
  Endpoint *endp;
  char *pcVar2;
  HelicsEndpoint pvVar3;
  string_view eptName;
  shared_ptr<helics::MessageFederate> fedObj;
  MessageFederate *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  getMessageFedSharedPtr(&local_30,(HelicsError *)fed);
  if (local_30 != (MessageFederate *)0x0) {
    if (name == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        pcVar2 = "The supplied string argument is null and therefore invalid";
LAB_001ad9fb:
        err->error_code = -4;
        err->message = pcVar2;
      }
    }
    else {
      sVar1 = strlen(name);
      eptName._M_str = name;
      eptName._M_len = sVar1;
      endp = helics::MessageFederate::getEndpoint(local_30,eptName);
      if ((endp->super_Interface).handle.hid != -1700000000) {
        pvVar3 = anon_unknown.dwarf_a42ce::findOrCreateEndpoint(fed,endp);
        goto LAB_001ada08;
      }
      if (err != (HelicsError *)0x0) {
        pcVar2 = "the specified Endpoint name is not recognized";
        goto LAB_001ad9fb;
      }
    }
  }
  pvVar3 = (HelicsEndpoint)0x0;
LAB_001ada08:
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return pvVar3;
}

Assistant:

HelicsEndpoint helicsFederateGetEndpoint(HelicsFederate fed, const char* name, HelicsError* err)
{
    auto fedObj = getMessageFedSharedPtr(fed, err);
    if (!fedObj) {
        return nullptr;
    }
    CHECK_NULL_STRING(name, nullptr);
    try {
        auto& ept = fedObj->getEndpoint(name);
        if (!ept.isValid()) {
            assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidEndName);
            return nullptr;
        }
        return findOrCreateEndpoint(fed, ept);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullptr;
    }
    // LCOV_EXCL_STOP
}